

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O2

void __thiscall ACustomBridge::Destroy(ACustomBridge *this)

{
  DThinker *pDVar1;
  AActor *pAVar2;
  TThinkerIterator<AActor> it;
  FThinkerIterator local_30;
  
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&local_30,0x80);
  while( true ) {
    pDVar1 = FThinkerIterator::Next(&local_30,false);
    if (pDVar1 == (DThinker *)0x0) break;
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&pDVar1[9].super_DObject.ObjNext);
    if (pAVar2 == &this->super_AActor) {
      (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
    }
  }
  AActor::Destroy(&this->super_AActor);
  return;
}

Assistant:

void ACustomBridge::Destroy()
{
	// Hexen originally just set a flag to make the bridge balls remove themselves in A_BridgeOrbit.
	// But this is not safe with custom bridge balls that do not necessarily call that function.
	// So the best course of action is to look for all bridge balls here and destroy them ourselves.
	
	TThinkerIterator<AActor> it;
	AActor *thing;
	
	while ((thing = it.Next()))
	{
		if (thing->target == this)
		{
			thing->Destroy();
		}
	}
	Super::Destroy();
}